

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

int Fraig_NodeVecCompareNumbers(Fraig_Node_t **pp1,Fraig_Node_t **pp2)

{
  int Num2;
  int Num1;
  Fraig_Node_t **pp2_local;
  Fraig_Node_t **pp1_local;
  
  if (*(int *)((ulong)*pp1 & 0xfffffffffffffffe) < *(int *)((ulong)*pp2 & 0xfffffffffffffffe)) {
    pp1_local._4_4_ = -1;
  }
  else if (*(int *)((ulong)*pp2 & 0xfffffffffffffffe) < *(int *)((ulong)*pp1 & 0xfffffffffffffffe))
  {
    pp1_local._4_4_ = 1;
  }
  else {
    pp1_local._4_4_ = 0;
  }
  return pp1_local._4_4_;
}

Assistant:

int Fraig_NodeVecCompareNumbers( Fraig_Node_t ** pp1, Fraig_Node_t ** pp2 )
{
    int Num1 = Fraig_Regular(*pp1)->Num;
    int Num2 = Fraig_Regular(*pp2)->Num;
    if ( Num1 < Num2 )
        return -1;
    if ( Num1 > Num2 )
        return 1;
    return 0; 
}